

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FixedLinearAllocator.hpp
# Opt level: O0

void __thiscall Diligent::FixedLinearAllocator::Reserve(FixedLinearAllocator *this)

{
  uchar *puVar1;
  int iVar2;
  Char *pCVar3;
  type tVar4;
  undefined4 extraout_var;
  uchar *puVar5;
  undefined1 local_80 [8];
  string msg_2;
  string msg_1;
  undefined1 local_30 [8];
  string msg;
  FixedLinearAllocator *this_local;
  
  msg.field_2._8_8_ = this;
  if (this->m_pDataStart != (uint8_t *)0x0) {
    FormatString<char[34]>((string *)local_30,(char (*) [34])"Memory has already been allocated");
    pCVar3 = (Char *)std::__cxx11::string::c_str();
    DebugAssertionFailed
              (pCVar3,"Reserve",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Common/interface/FixedLinearAllocator.hpp"
               ,0xd0);
    std::__cxx11::string::~string((string *)local_30);
  }
  if (this->m_pAllocator == (IMemoryAllocator *)0x0) {
    FormatString<char[27]>
              ((string *)((long)&msg_2.field_2 + 8),(char (*) [27])"Allocator must not be null");
    pCVar3 = (Char *)std::__cxx11::string::c_str();
    DebugAssertionFailed
              (pCVar3,"Reserve",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Common/interface/FixedLinearAllocator.hpp"
               ,0xd1);
    std::__cxx11::string::~string((string *)(msg_2.field_2._M_local_buf + 8));
  }
  tVar4 = AlignUp<unsigned_long,unsigned_long>(this->m_ReservedSize,8);
  this->m_ReservedSize = tVar4;
  if (this->m_ReservedSize != 0) {
    iVar2 = (**this->m_pAllocator->_vptr_IMemoryAllocator)
                      (this->m_pAllocator,this->m_ReservedSize,"Raw memory for linear allocator",
                       "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Common/interface/FixedLinearAllocator.hpp"
                       ,0xd6);
    this->m_pDataStart = (uint8_t *)CONCAT44(extraout_var,iVar2);
    puVar1 = this->m_pDataStart;
    puVar5 = AlignUp<unsigned_char,unsigned_long>(this->m_pDataStart,8);
    if (puVar1 != puVar5) {
      FormatString<char[54]>
                ((string *)local_80,
                 (char (*) [54])"Memory pointer must be at least sizeof(void*)-aligned");
      pCVar3 = (Char *)std::__cxx11::string::c_str();
      DebugAssertionFailed
                (pCVar3,"Reserve",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Common/interface/FixedLinearAllocator.hpp"
                 ,0xd7);
      std::__cxx11::string::~string((string *)local_80);
    }
    this->m_pCurrPtr = this->m_pDataStart;
  }
  this->m_CurrAlignment = 8;
  return;
}

Assistant:

void Reserve()
    {
        VERIFY(m_pDataStart == nullptr, "Memory has already been allocated");
        VERIFY(m_pAllocator != nullptr, "Allocator must not be null");
        // Make sure the data size is at least sizeof(void*)-aligned
        m_ReservedSize = AlignUp(m_ReservedSize, sizeof(void*));
        if (m_ReservedSize > 0)
        {
            m_pDataStart = reinterpret_cast<uint8_t*>(m_pAllocator->Allocate(m_ReservedSize, "Raw memory for linear allocator", __FILE__, __LINE__));
            VERIFY(m_pDataStart == AlignUp(m_pDataStart, sizeof(void*)), "Memory pointer must be at least sizeof(void*)-aligned");

            m_pCurrPtr = m_pDataStart;
        }
        m_CurrAlignment = sizeof(void*);
    }